

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::Logger::logv(Logger *this,char *fmt,__va_list_tag *ap)

{
  Error EVar1;
  ulong uVar2;
  undefined1 *puVar3;
  StringTmp<2048UL> sb;
  undefined8 local_838;
  ulong uStack_830;
  undefined8 local_828;
  undefined1 *puStack_820;
  undefined1 local_818 [2056];
  
  puStack_820 = local_818;
  uStack_830 = 0;
  local_838 = 0x20;
  local_828 = 0x807;
  local_818[0] = 0;
  EVar1 = String::_opVFormat((String *)&local_838,kAppend,fmt,ap);
  if (EVar1 == 0) {
    uVar2 = uStack_830;
    puVar3 = puStack_820;
    if ((local_838 & 0xff) < 0x1f) {
      uVar2 = local_838 & 0xff;
      puVar3 = (undefined1 *)((long)&local_838 + 1);
    }
    EVar1 = (*this->_vptr_Logger[2])(this,puVar3,uVar2);
  }
  String::reset((String *)&local_838);
  return EVar1;
}

Assistant:

Error Logger::logv(const char* fmt, va_list ap) noexcept {
  StringTmp<2048> sb;
  ASMJIT_PROPAGATE(sb.appendVFormat(fmt, ap));
  return log(sb);
}